

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O2

UniValue * ValueFromAmount(UniValue *__return_storage_ptr__,CAmount amount)

{
  string str;
  long *in_R9;
  long in_FS_OFFSET;
  undefined8 uStack_58;
  char *local_50;
  int64_t remainder;
  int64_t quotient;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  quotient = amount / 100000000;
  remainder = amount % 100000000;
  if (amount < 0) {
    quotient = -quotient;
    remainder = -remainder;
    local_50 = "-";
  }
  else {
    local_50 = "";
  }
  tinyformat::format<char_const*,long,long>
            (&local_38,(tinyformat *)"%s%d.%08d",(char *)&local_50,(char **)&quotient,&remainder,
             in_R9);
  str._M_string_length = (size_type)local_50;
  str._M_dataplus._M_p = (pointer)uStack_58;
  str.field_2._M_allocated_capacity = remainder;
  str.field_2._8_8_ = quotient;
  UniValue::UniValue(__return_storage_ptr__,VNUM,str);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ValueFromAmount(const CAmount amount)
{
    static_assert(COIN > 1);
    int64_t quotient = amount / COIN;
    int64_t remainder = amount % COIN;
    if (amount < 0) {
        quotient = -quotient;
        remainder = -remainder;
    }
    return UniValue(UniValue::VNUM,
            strprintf("%s%d.%08d", amount < 0 ? "-" : "", quotient, remainder));
}